

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O0

void HPDF_MD5Update(HPDF_MD5Context *ctx,HPDF_BYTE *buf,HPDF_UINT32 len)

{
  uint uVar1;
  uint uVar2;
  HPDF_BYTE *p;
  HPDF_UINT32 t;
  HPDF_UINT32 len_local;
  HPDF_BYTE *buf_local;
  HPDF_MD5Context *ctx_local;
  
  uVar2 = ctx->bits[0];
  uVar1 = uVar2 + len * 8;
  ctx->bits[0] = uVar1;
  if (uVar1 < uVar2) {
    ctx->bits[1] = ctx->bits[1] + 1;
  }
  ctx->bits[1] = (len >> 0x1d) + ctx->bits[1];
  uVar2 = uVar2 >> 3 & 0x3f;
  p._4_4_ = len;
  _t = buf;
  if (uVar2 != 0) {
    uVar1 = 0x40 - uVar2;
    if (len < uVar1) {
      HPDF_MemCpy(ctx->in + uVar2,buf,len);
      return;
    }
    HPDF_MemCpy(ctx->in + uVar2,buf,uVar1);
    MD5ByteReverse(ctx->in,0x10);
    MD5Transform(ctx->buf,(HPDF_UINT32 *)ctx->in);
    _t = buf + uVar1;
    p._4_4_ = len - uVar1;
  }
  for (; 0x3f < p._4_4_; p._4_4_ = p._4_4_ - 0x40) {
    HPDF_MemCpy(ctx->in,_t,0x40);
    MD5ByteReverse(ctx->in,0x10);
    MD5Transform(ctx->buf,(HPDF_UINT32 *)ctx->in);
    _t = _t + 0x40;
  }
  HPDF_MemCpy(ctx->in,_t,p._4_4_);
  return;
}

Assistant:

void
HPDF_MD5Update  (struct HPDF_MD5Context *ctx,
                 const HPDF_BYTE        *buf,
                 HPDF_UINT32            len)
{
    HPDF_UINT32 t;

    /* Update bitcount */

    t = ctx->bits[0];
    if ((ctx->bits[0] = t + ((HPDF_UINT32) len << 3)) < t)
        ctx->bits[1]++;     /* Carry from low to high */
    ctx->bits[1] += len >> 29;

    t = (t >> 3) & 0x3f; /* Bytes already in shsInfo->data */

    /* Handle any leading odd-sized chunks */

    if (t) {
        HPDF_BYTE *p = (HPDF_BYTE *) ctx->in + t;

        t = 64 - t;
        if (len < t)
        {
            HPDF_MemCpy (p, buf, len);
            return;
        }
        HPDF_MemCpy (p, buf, t);
        MD5ByteReverse (ctx->in, 16);
        MD5Transform (ctx->buf, (HPDF_UINT32 *) ctx->in);
        buf += t;
        len -= t;
    }
    /* Process data in 64-byte chunks */

    while (len >= 64) {
        HPDF_MemCpy (ctx->in, buf, 64);
        MD5ByteReverse (ctx->in, 16);
        MD5Transform (ctx->buf, (HPDF_UINT32 *) ctx->in);
        buf += 64;
        len -= 64;
    }

    /* Handle any remaining bytes of data. */

    HPDF_MemCpy (ctx->in, buf, len);
}